

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

int extend_borders_mt(AV1_COMP *cpi,MULTI_THREADED_MODULES stage,int plane)

{
  AV1_COMMON *cm;
  int iVar1;
  bool bVar2;
  
  if ((cpi->mt_info).num_mod_workers[stage] < 2) {
    bVar2 = false;
  }
  else {
    cm = &cpi->common;
    if (stage == MOD_LR) {
      iVar1 = is_restoration_used(cm);
      if (iVar1 != 0) {
        bVar2 = (cpi->common).rst_info[plane].frame_restoration_type != RESTORE_NONE;
        goto LAB_001abcba;
      }
    }
    else {
      iVar1 = is_cdef_used(cm);
      if (((iVar1 != 0) && ((cpi->ppi->rtc_ref).non_reference_frame == 0)) &&
         (iVar1 = is_restoration_used(cm), iVar1 == 0)) {
        bVar2 = (cpi->common).width == (cpi->common).superres_upscaled_width;
        goto LAB_001abcba;
      }
    }
    bVar2 = false;
  }
LAB_001abcba:
  return (int)bVar2;
}

Assistant:

static inline int extend_borders_mt(const AV1_COMP *cpi,
                                    MULTI_THREADED_MODULES stage, int plane) {
  const AV1_COMMON *const cm = &cpi->common;
  if (cpi->mt_info.num_mod_workers[stage] < 2) return 0;
  switch (stage) {
    // TODO(deepa.kg@ittiam.com): When cdef and loop-restoration are disabled,
    // multi-thread frame border extension along with loop filter frame.
    // As loop-filtering of a superblock row modifies the pixels of the
    // above superblock row, border extension requires that loop filtering
    // of the current and above superblock row is complete.
    case MOD_LPF: return 0;
    case MOD_CDEF:
      return is_cdef_used(cm) && !cpi->ppi->rtc_ref.non_reference_frame &&
             !is_restoration_used(cm) && !av1_superres_scaled(cm);
    case MOD_LR:
      return is_restoration_used(cm) &&
             (cm->rst_info[plane].frame_restoration_type != RESTORE_NONE);
    default: assert(0);
  }
  return 0;
}